

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub-sub.c
# Opt level: O0

void ps_publish_content(uint8_t service,ps_event_t *event)

{
  ndn_key_storage_t *component;
  ndn_time_ms_t nVar1;
  ndn_aes_key_t *pnVar2;
  ndn_name_t *pnVar3;
  ndn_ecc_prv_t *pnVar4;
  ndn_ecc_prv_t *signing_identity_key;
  ndn_name_t *signing_identity;
  uint32_t default_freshness_period;
  ndn_aes_key_t *service_aes_key;
  uint32_t used_size;
  name_component_t tp_comp;
  int i_1;
  int index;
  uint64_t min_last_tp;
  pub_topic_t *ppStack_1f8;
  int i;
  pub_topic_t *topic;
  ndn_key_storage_t *storage;
  ndn_name_t name;
  int ret;
  ps_event_t *event_local;
  uint8_t service_local;
  
  unique0x10000723 = event;
  event_local._7_1_ = service;
  if (!m_has_initialized) {
    _ps_topics_init();
  }
  name.components[9].size = '\0';
  name.components[9]._41_3_ = 0;
  ndn_name_init((ndn_name_t *)&storage);
  component = ndn_key_storage_get_instance();
  ndn_name_append_component((ndn_name_t *)&storage,(name_component_t *)component);
  ndn_name_append_bytes_component((ndn_name_t *)&storage,(uint8_t *)((long)&event_local + 7),1);
  ndn_name_append_string_component((ndn_name_t *)&storage,"DATA",4);
  ppStack_1f8 = _match_pub_topic(event_local._7_1_,false);
  if (ppStack_1f8 == (pub_topic_t *)0x0) {
    for (min_last_tp._4_4_ = 0; min_last_tp._4_4_ < 5; min_last_tp._4_4_ = min_last_tp._4_4_ + 1) {
      if (m_pub_sub_state.pub_topics[min_last_tp._4_4_].service == 0xff) {
        ppStack_1f8 = m_pub_sub_state.pub_topics + min_last_tp._4_4_;
        break;
      }
    }
    if (ppStack_1f8 == (pub_topic_t *)0x0) {
      printf("INFO: %s: ","ps_publish_content");
      printf("[PUB/SUB] No availble topic, will drop the oldest pub topic.");
      printf("\n");
      _i_1 = m_pub_sub_state.pub_topics[0].last_update_tp;
      tp_comp.size = '\0';
      tp_comp._41_3_ = 0;
      tp_comp.value[0x20] = '\x01';
      tp_comp.value[0x21] = '\0';
      tp_comp.value[0x22] = '\0';
      tp_comp.value[0x23] = '\0';
      for (; (int)tp_comp.value._32_4_ < 5; tp_comp.value._32_4_ = tp_comp.value._32_4_ + 1) {
        if (m_pub_sub_state.pub_topics[(int)tp_comp.value._32_4_].last_update_tp < _i_1) {
          _i_1 = m_pub_sub_state.pub_topics[(int)tp_comp.value._32_4_].last_update_tp;
          tp_comp.size = tp_comp.value[0x20];
          tp_comp._41_1_ = tp_comp.value[0x21];
          tp_comp._42_1_ = tp_comp.value[0x22];
          tp_comp._43_1_ = tp_comp.value[0x23];
        }
      }
      ppStack_1f8 = m_pub_sub_state.pub_topics + (int)tp_comp._40_4_;
    }
    name.components[9]._40_4_ =
         ndn_forwarder_register_name_prefix
                   ((ndn_name_t *)&storage,_on_subscription_interest,ppStack_1f8);
    if (name.components[9]._40_4_ != 0) {
      printf("ERROR: %s, L%d: ","ps_publish_content",0x25a);
      printf("[PUB/SUB] Cannot register prefix for newly published content. Error Code: %d",
             (ulong)(uint)name.components[9]._40_4_);
    }
    ppStack_1f8->service = event_local._7_1_;
    ppStack_1f8->is_cmd = false;
  }
  nVar1 = ndn_time_now_ms();
  ppStack_1f8->last_update_tp = nVar1;
  ndn_name_append_component
            ((ndn_name_t *)&storage,
             component->self_identity[0].components +
             (int)(component->self_identity[0].components_size - 2));
  ndn_name_append_component
            ((ndn_name_t *)&storage,
             component->self_identity[0].components +
             (int)(component->self_identity[0].components_size - 1));
  ndn_name_append_bytes_component
            ((ndn_name_t *)&storage,stack0xffffffffffffffd8->data_id,
             stack0xffffffffffffffd8->data_id_len);
  name_component_from_timestamp
            ((name_component_t *)((long)&service_aes_key + 4),ppStack_1f8->last_update_tp);
  ndn_name_append_component((ndn_name_t *)&storage,(name_component_t *)((long)&service_aes_key + 4))
  ;
  m_measure_tp1 = ndn_time_now_us();
  service_aes_key._0_4_ = 0;
  pnVar2 = ndn_ac_get_key_for_service(ppStack_1f8->service);
  name.components[9]._40_4_ =
       ndn_gen_encrypted_payload
                 (stack0xffffffffffffffd8->payload,stack0xffffffffffffffd8->payload_len,
                  pkt_encoding_buf,(uint32_t *)&service_aes_key,pnVar2->key_id,(uint8_t *)0x0,0);
  m_measure_tp2 = ndn_time_now_us();
  printf("DEBUG: %s, L%d: ","ps_publish_content",0x276);
  printf("[PUB/SUB] PUB-CONTENT-DATA-AES-ENC: %lu\n");
  if (name.components[9]._40_4_ == 0) {
    memset(ppStack_1f8->cache,0,300);
    if (stack0xffffffffffffffd8->freshness_period == 0) {
      signing_identity._4_4_ = 8000;
    }
    else {
      signing_identity._4_4_ = stack0xffffffffffffffd8->freshness_period;
    }
    pnVar3 = ndn_key_storage_get_self_identity(event_local._7_1_);
    pnVar4 = ndn_key_storage_get_self_identity_key(event_local._7_1_);
    if ((pnVar3 == (ndn_name_t *)0x0) || (pnVar4 == (ndn_ecc_prv_t *)0x0)) {
      printf("ERROR: %s, L%d: ","ps_publish_content",0x28c);
      printf("[PUB/SUB] Cannot find proper identity to sign");
    }
    else {
      name.components[9]._40_4_ =
           tlv_make_data(ppStack_1f8->cache,300,(size_t *)&ppStack_1f8->cache_size,7,0,&storage,8,
                         pkt_encoding_buf,9,service_aes_key._0_4_,4,(ulong)signing_identity._4_4_,10
                         ,3,0xb,pnVar3,0xc,pnVar4);
      if (name.components[9]._40_4_ == 0) {
        printf("DEBUG: %s, L%d: ","ps_publish_content",0x29b);
        printf("[PUB/SUB] PUB-CONTENT-PKT-SIZE: %u Bytes\n",(ulong)ppStack_1f8->cache_size);
        printf("INFO: %s: ","ps_publish_content");
        printf("[PUB/SUB] Content Data has been generated");
        printf("\n");
        ndn_name_print((ndn_name_t *)&storage);
      }
      else {
        printf("ERROR: %s, L%d: ","ps_publish_content",0x298);
        printf("[PUB/SUB] Content Data cannot be generated. Error code: %d",
               (ulong)(uint)name.components[9]._40_4_);
      }
    }
  }
  else {
    printf("ERROR: %s, L%d: ","ps_publish_content",0x27b);
    printf("[PUB/SUB] Cannot encrypt content to publish. Error code: %d",
           (ulong)(uint)name.components[9]._40_4_);
  }
  return;
}

Assistant:

void
ps_publish_content(uint8_t service, const ps_event_t* event)
{
  if (!m_has_initialized)
    _ps_topics_init();

  int ret = 0;
  // Prefix FORMAT: /home/service/DATA
  ndn_name_t name;
  ndn_name_init(&name);
  ndn_key_storage_t* storage = ndn_key_storage_get_instance();
  ndn_name_append_component(&name, &storage->self_identity[0].components[0]);
  ndn_name_append_bytes_component(&name, &service, sizeof(service));
  ndn_name_append_string_component(&name, "DATA", strlen("DATA"));

  // published on this topic before? update the cache
  pub_topic_t* topic = NULL;
  topic = _match_pub_topic(service, false);
  if (!topic) {
    for (int i = 0; i < 5; i++) {
      if (m_pub_sub_state.pub_topics[i].service == NDN_SD_NONE) {
        topic = &m_pub_sub_state.pub_topics[i];
        break;
      }
    }
    if (topic == NULL) {
      NDN_LOG_INFO("[PUB/SUB] No availble topic, will drop the oldest pub topic.");
      uint64_t min_last_tp = m_pub_sub_state.pub_topics[0].last_update_tp;
      int index = 0;
      for (int i = 1; i < 5; i++) {
        if (m_pub_sub_state.pub_topics[i].last_update_tp < min_last_tp) {
          min_last_tp = m_pub_sub_state.pub_topics[i].last_update_tp;
          index = i;
        }
      }
      topic = &m_pub_sub_state.pub_topics[index];
      // TODO: unregister the prefix registered by the old topic
    }
    // register the new prefix
    ret = ndn_forwarder_register_name_prefix(&name, _on_subscription_interest, topic);
    if (ret != NDN_SUCCESS) {
      NDN_LOG_ERROR("[PUB/SUB] Cannot register prefix for newly published content. Error Code: %d", ret);
    }
    topic->service = service;
    topic->is_cmd = false;
  }
  topic->last_update_tp = ndn_time_now_ms();
  // Append the last several component to the Data name
  // Data name FORMAT: /home/service/DATA/room/device-id/content-id/tp
  /* given that all self_identity have same <room> and <device-id>, this is fine */
  ndn_name_append_component(&name, &storage->self_identity[0].components[storage->self_identity[0].components_size - 2]);
  ndn_name_append_component(&name, &storage->self_identity[0].components[storage->self_identity[0].components_size - 1]);
  ndn_name_append_bytes_component(&name, event->data_id, event->data_id_len);
  name_component_t tp_comp;
  name_component_from_timestamp(&tp_comp, topic->last_update_tp);
  ndn_name_append_component(&name, &tp_comp);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  // Encrypt payload
  uint32_t used_size = 0;
  ndn_aes_key_t* service_aes_key = ndn_ac_get_key_for_service(topic->service);
  ret = ndn_gen_encrypted_payload(event->payload, event->payload_len, pkt_encoding_buf, &used_size,
                                  service_aes_key->key_id, NULL, 0);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("[PUB/SUB] PUB-CONTENT-DATA-AES-ENC: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif


  if (ret != NDN_SUCCESS) {
    NDN_LOG_ERROR("[PUB/SUB] Cannot encrypt content to publish. Error code: %d", ret);
    return;
  }

  memset(topic->cache, 0, sizeof(topic->cache));
  uint32_t default_freshness_period = 0;
  if (!event->freshness_period) {
    // this user does not define the freshness period, it will pick 8000ms as default
    default_freshness_period = 8000;
  }
  else {
    default_freshness_period = event->freshness_period;
  }
  // select identity key
  ndn_name_t* signing_identity = ndn_key_storage_get_self_identity(service);
  ndn_ecc_prv_t* signing_identity_key = ndn_key_storage_get_self_identity_key(service);
  if (signing_identity == NULL || signing_identity_key == NULL) {
    NDN_LOG_ERROR("[PUB/SUB] Cannot find proper identity to sign");
    return;
  }
  ret = tlv_make_data(topic->cache, sizeof(topic->cache), (size_t *) &topic->cache_size, 7,
                      TLV_DATAARG_NAME_PTR, &name,
                      TLV_DATAARG_CONTENT_BUF, pkt_encoding_buf,
                      TLV_DATAARG_CONTENT_SIZE, used_size,
                      TLV_DATAARG_FRESHNESSPERIOD_U64, (uint64_t)default_freshness_period,
                      TLV_DATAARG_SIGTYPE_U8, NDN_SIG_TYPE_ECDSA_SHA256,
                      TLV_DATAARG_IDENTITYNAME_PTR, signing_identity,
                      TLV_DATAARG_SIGKEY_PTR, signing_identity_key);
  if (ret != NDN_SUCCESS) {
    NDN_LOG_ERROR("[PUB/SUB] Content Data cannot be generated. Error code: %d", ret);
    return;
  }
  NDN_LOG_DEBUG("[PUB/SUB] PUB-CONTENT-PKT-SIZE: %u Bytes\n", topic->cache_size);
  NDN_LOG_INFO("[PUB/SUB] Content Data has been generated");
  NDN_LOG_INFO_NAME(&name);
}